

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::reportOnPossibleLpDualInfeasibility(HEkkDual *this)

{
  HEkk *pHVar1;
  char *pcVar2;
  string lp_dual_status;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  pHVar1 = this->ekk_instance_;
  local_30 = 0;
  local_28[0] = 0;
  pcVar2 = "infeasible";
  if ((pHVar1->analysis_).num_dual_phase_1_lp_dual_infeasibility == 0) {
    pcVar2 = "feasible";
  }
  local_38 = local_28;
  std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,(ulong)pcVar2);
  highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kInfo,
              "LP is dual %s with dual phase 1 objective %10.4g and num / max / sum dual infeasibilities = %d / %9.4g / %9.4g\n"
              ,(pHVar1->info_).dual_objective_value,
              (pHVar1->analysis_).max_dual_phase_1_lp_dual_infeasibility,
              (pHVar1->analysis_).sum_dual_phase_1_lp_dual_infeasibility,local_38,
              (ulong)(uint)(pHVar1->analysis_).num_dual_phase_1_lp_dual_infeasibility);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void HEkkDual::reportOnPossibleLpDualInfeasibility() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsSimplexAnalysis& analysis = ekk_instance_.analysis_;
  assert(solve_phase == kSolvePhase1);
  assert(row_out == kNoRowChosen);
  //  assert(info.dual_objective_value < 0);
  assert(!info.costs_perturbed);
  std::string lp_dual_status;
  if (analysis.num_dual_phase_1_lp_dual_infeasibility) {
    lp_dual_status = "infeasible";
  } else {
    lp_dual_status = "feasible";
  }
  highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
              "LP is dual %s with dual phase 1 objective %10.4g and num / "
              "max / sum dual infeasibilities = %" HIGHSINT_FORMAT
              " / %9.4g / %9.4g\n",
              lp_dual_status.c_str(), info.dual_objective_value,
              analysis.num_dual_phase_1_lp_dual_infeasibility,
              analysis.max_dual_phase_1_lp_dual_infeasibility,
              analysis.sum_dual_phase_1_lp_dual_infeasibility);
}